

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping_padding.cpp
# Opt level: O3

void test_2d_static<5ul,5ul,1ul,0ul,30ul,30ul>(void)

{
  bool *pbVar1;
  char cVar2;
  undefined7 uVar3;
  int line;
  ulong uVar4;
  int j;
  long lVar5;
  int j_1;
  char *expr2;
  long lVar6;
  bool *pbVar7;
  char cVar8;
  size_t true_idx;
  int dptr [930];
  bool *local_ef0;
  bool *local_ee8;
  bool *local_ee0;
  bool *local_ed8;
  bool *local_ed0;
  long local_ec8;
  bool *local_ec0;
  bool local_eb8 [3720];
  
  local_eb8[0] = true;
  local_ee8 = (bool *)CONCAT71(local_ee8._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x26,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,local_eb8,(bool *)&local_ee8);
  local_eb8[0] = true;
  local_eb8[1] = false;
  local_eb8[2] = false;
  local_eb8[3] = false;
  local_eb8[4] = false;
  local_eb8[5] = false;
  local_eb8[6] = false;
  local_eb8[7] = false;
  local_ee8._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x28,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_eb8,(int *)&local_ee8);
  local_eb8[0] = true;
  local_eb8[1] = false;
  local_eb8[2] = false;
  local_eb8[3] = false;
  local_eb8[4] = false;
  local_eb8[5] = false;
  local_eb8[6] = false;
  local_eb8[7] = false;
  local_ee8 = (bool *)CONCAT44(local_ee8._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x29,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_eb8,(int *)&local_ee8);
  local_eb8[0] = true;
  local_eb8[1] = true;
  local_eb8[2] = false;
  local_eb8[3] = false;
  local_eb8[4] = false;
  local_eb8[5] = false;
  local_eb8[6] = false;
  local_eb8[7] = false;
  local_ee8 = (bool *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x2b,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_eb8,(unsigned_long *)&local_ee8);
  local_eb8[0] = true;
  local_eb8[1] = true;
  local_eb8[2] = false;
  local_eb8[3] = false;
  local_eb8[4] = false;
  local_eb8[5] = false;
  local_eb8[6] = false;
  local_eb8[7] = false;
  local_ee8 = (bool *)0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x2c,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_eb8,(unsigned_long *)&local_ee8);
  local_eb8[0] = true;
  local_ee8 = (bool *)CONCAT71(local_ee8._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x34,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,local_eb8,(bool *)&local_ee8);
  local_eb8[0] = true;
  local_eb8[1] = false;
  local_eb8[2] = false;
  local_eb8[3] = false;
  local_eb8[4] = false;
  local_eb8[5] = false;
  local_eb8[6] = false;
  local_eb8[7] = false;
  local_ee8 = (bool *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x36,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_eb8,(unsigned_long *)&local_ee8);
  local_eb8[0] = true;
  local_eb8[1] = false;
  local_eb8[2] = false;
  local_eb8[3] = false;
  local_eb8[4] = false;
  local_eb8[5] = false;
  local_eb8[6] = false;
  local_eb8[7] = false;
  local_ee8 = (bool *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x37,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_eb8,(unsigned_long *)&local_ee8);
  local_eb8[0] = true;
  local_eb8[1] = false;
  local_eb8[2] = false;
  local_eb8[3] = false;
  local_eb8[4] = false;
  local_eb8[5] = false;
  local_eb8[6] = false;
  local_eb8[7] = false;
  local_ee8 = (bool *)0x24;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x39,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_eb8,(unsigned_long *)&local_ee8);
  local_eb8[0] = true;
  local_eb8[1] = true;
  local_eb8[2] = false;
  local_eb8[3] = false;
  local_eb8[4] = false;
  local_eb8[5] = false;
  local_eb8[6] = false;
  local_eb8[7] = false;
  local_ee8 = (bool *)0x3a2;
  pbVar7 = local_eb8;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
             ,0x3a,
             "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)pbVar7,(unsigned_long *)&local_ee8);
  lVar5 = 0;
  do {
    lVar6 = 0;
    local_ee0 = pbVar7;
    do {
      local_ef0 = (bool *)(lVar5 + lVar6);
      local_ee8 = local_ef0;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x44,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_ef0,(unsigned_long *)&local_ee8);
      local_ed8 = local_eb8 + (long)local_ee8 * 4;
      local_ef0 = pbVar7;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x46,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_ef0,(int **)&local_ed8);
      pbVar7[0] = true;
      pbVar7[1] = false;
      pbVar7[2] = false;
      pbVar7[3] = false;
      local_ef0 = (bool *)CONCAT44(local_ef0._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x4a,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int *)pbVar7,(int *)&local_ef0);
      lVar6 = lVar6 + 0x1e;
      pbVar7 = pbVar7 + 0x78;
    } while (lVar6 != 900);
    lVar5 = lVar5 + 1;
    pbVar7 = local_ee0 + 4;
  } while (lVar5 != 0x1e);
  pbVar7 = local_eb8;
  lVar5 = 0;
  do {
    lVar6 = 0;
    local_ee0 = pbVar7;
    while( true ) {
      local_ef0 = (bool *)(lVar6 + lVar5);
      local_ee8 = local_ef0;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x53,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_ef0,(unsigned_long *)&local_ee8);
      local_ed8 = local_eb8 + (long)local_ee8 * 4;
      local_ef0 = pbVar7;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x55,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_ef0,(int **)&local_ed8);
      if (lVar6 == 900) break;
      pbVar7 = pbVar7 + 0x78;
      lVar6 = lVar6 + 0x1e;
    }
    pbVar7[0] = true;
    pbVar7[1] = false;
    pbVar7[2] = false;
    pbVar7[3] = false;
    local_ef0 = (bool *)CONCAT44(local_ef0._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
               ,0x5c,
               "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
               ,(int *)pbVar7,(int *)&local_ef0);
    lVar5 = lVar5 + 1;
    pbVar7 = local_ee0 + 4;
  } while (lVar5 != 0x1e);
  pbVar7 = local_eb8;
  local_ee0 = (bool *)0x0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    local_ed0 = pbVar7;
    local_ec8 = lVar5;
    do {
      local_ef0 = (bool *)((long)local_ee0 + lVar6);
      local_ee8 = local_ef0;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x70,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_ef0,(unsigned_long *)&local_ee8);
      local_ed8 = local_eb8 + (long)local_ee8 * 4;
      local_ef0 = pbVar7;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x72,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_ef0,(int **)&local_ed8);
      pbVar7[0] = true;
      pbVar7[1] = false;
      pbVar7[2] = false;
      pbVar7[3] = false;
      local_ef0 = (bool *)CONCAT44(local_ef0._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x76,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int *)pbVar7,(int *)&local_ef0);
      lVar6 = lVar6 + 0x96;
      pbVar7 = pbVar7 + 600;
    } while (lVar6 != 900);
    lVar5 = local_ec8 + 1;
    local_ee0 = (bool *)((long)local_ee0 + 5);
    pbVar7 = local_ed0 + 0x14;
  } while (lVar5 != 6);
  pbVar7 = local_eb8;
  uVar4 = 0;
  do {
    local_ec8 = CONCAT44(local_ec8._4_4_,(int)uVar4 + (int)((uVar4 & 0xffffffff) / 5) * -5);
    lVar5 = 0;
    local_ee0 = (bool *)0x0;
    local_ed0._0_1_ = '\0';
    local_ed0._1_7_ = 0;
    local_ec0 = pbVar7;
    while( true ) {
      local_ef0 = (bool *)(uVar4 + lVar5);
      local_ee8 = local_ef0;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x7f,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_ef0,(unsigned_long *)&local_ee8);
      local_ed8 = local_eb8 + (long)local_ee8 * 4;
      local_ef0 = pbVar7;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,0x81,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_ef0,(int **)&local_ed8);
      uVar3 = local_ed0._1_7_;
      cVar2 = (char)local_ed0;
      pbVar1 = local_ee0;
      if (lVar5 == 900) break;
      cVar8 = (char)local_ee0;
      if (((int)local_ec8 == 0) &&
         ((char)((char)(((uint)local_ee0 & 0xff) / 5) * '\x05' + (char)local_ed0) == '\0')) {
        local_ef0 = (bool *)CONCAT44(local_ef0._4_4_,0x47);
        expr2 = "71";
        line = 0x97;
      }
      else {
        local_ef0 = (bool *)CONCAT44(local_ef0._4_4_,0x2a);
        expr2 = "42";
        line = 0x9c;
      }
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])",expr2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
                 ,line,
                 "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
                 ,(int *)pbVar7,(int *)&local_ef0);
      local_ed0._0_1_ = cVar2 + -1;
      local_ee0 = (bool *)CONCAT71((int7)((ulong)pbVar1 >> 8),cVar8 + '\x01');
      lVar5 = lVar5 + 0x1e;
      pbVar7 = pbVar7 + 0x78;
      local_ed0._1_7_ = uVar3;
    }
    local_ef0 = (bool *)CONCAT44(local_ef0._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping_padding.cpp"
               ,0x86,
               "void test_2d_static() [StepX = 5UL, StepY = 5UL, PadX = 1UL, PadY = 0UL, X = 30UL, Y = 30UL]"
               ,(int *)pbVar7,(int *)&local_ef0);
    uVar4 = uVar4 + 1;
    pbVar7 = local_ec0 + 4;
  } while (uVar4 != 0x1e);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % StepX), "X must be divisable by StepX");
    static_assert(0 == (Y % StepY), "Y must be divisable by StepY");

    layout_mapping_right<
        dimensions<X, Y>
      , dimensions<1, 1>
      , dimensions<PadX, PadY>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_right<
        dimensions<X / StepX, Y / StepY>
      , dimensions<StepX, StepY>
      , dimensions<PadX, PadY>
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    int dptr[(X + PadX) * (Y + PadY)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.padding();
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1] + p[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.stepping()[0]))
               && (0 == (j % sub_l.stepping()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
            }
        }
    }
}